

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

Variable *
skiwi::make_variable
          (Variable *__return_storage_ptr__,
          vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  int line_nr;
  int column_nr;
  bool bVar1;
  e_type eVar2;
  reference pvVar3;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_00;
  string local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  _anonymous_namespace_ *local_18;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_local;
  Variable *v;
  
  local_18 = (_anonymous_namespace_ *)tokens;
  tokens_local = (vector<skiwi::token,_std::allocator<skiwi::token>_> *)__return_storage_ptr__;
  bVar1 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::empty(tokens);
  if (bVar1) {
    anon_unknown_2::throw_parse_error(no_tokens);
  }
  eVar2 = anon_unknown_2::current_type
                    ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  if (eVar2 != T_ID) {
    pvVar3 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    line_nr = pvVar3->line_nr;
    pvVar3 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                       ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
    column_nr = pvVar3->column_nr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
    anon_unknown_2::throw_parse_error(line_nr,column_nr,bad_syntax,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  local_4d = 0;
  Variable::Variable(__return_storage_ptr__);
  pvVar3 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                     ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  __return_storage_ptr__->line_nr = pvVar3->line_nr;
  pvVar3 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::back
                     ((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  __return_storage_ptr__->column_nr = pvVar3->column_nr;
  (anonymous_namespace)::current_abi_cxx11_(&local_70,local_18,tokens_00);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  anon_unknown_2::advance((vector<skiwi::token,_std::allocator<skiwi::token>_> *)local_18);
  return __return_storage_ptr__;
}

Assistant:

Variable make_variable(std::vector<token>& tokens)
  {
  if (tokens.empty())
    throw_parse_error(no_tokens);
  if (current_type(tokens) != token::T_ID)
    throw_parse_error(tokens.back().line_nr, tokens.back().column_nr, bad_syntax);
  Variable v;
  v.line_nr = tokens.back().line_nr;
  v.column_nr = tokens.back().column_nr;
  v.name = current(tokens);
  advance(tokens);
  return v;
  }